

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O3

void __thiscall Fl_Comment_Type::read_property(Fl_Comment_Type *this,char *c)

{
  int iVar1;
  
  iVar1 = strcmp(c,"in_source");
  if (iVar1 == 0) {
    this->in_c_ = '\x01';
  }
  else {
    iVar1 = strcmp(c,"not_in_source");
    if (iVar1 == 0) {
      this->in_c_ = '\0';
    }
    else {
      iVar1 = strcmp(c,"in_header");
      if (iVar1 == 0) {
        this->in_h_ = '\x01';
      }
      else {
        iVar1 = strcmp(c,"not_in_header");
        if (iVar1 != 0) {
          Fl_Type::read_property(&this->super_Fl_Type,c);
          return;
        }
        this->in_h_ = '\0';
      }
    }
  }
  return;
}

Assistant:

void Fl_Comment_Type::read_property(const char *c) {
  if (!strcmp(c,"in_source")) {
    in_c_ = 1;
  } else if (!strcmp(c,"not_in_source")) {
    in_c_ = 0;
  } else if (!strcmp(c,"in_header")) {
    in_h_ = 1;
  } else if (!strcmp(c,"not_in_header")) {
    in_h_ = 0;
  } else {
    Fl_Type::read_property(c);
  }
}